

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O1

LossParameter * __thiscall caffe::LossParameter::New(LossParameter *this,Arena *arena)

{
  LossParameter *this_00;
  
  this_00 = (LossParameter *)operator_new(0x28);
  LossParameter(this_00);
  if (arena != (Arena *)0x0) {
    google::protobuf::Arena::Own<caffe::LossParameter>(arena,this_00);
  }
  return this_00;
}

Assistant:

LossParameter* LossParameter::New(::google::protobuf::Arena* arena) const {
  LossParameter* n = new LossParameter;
  if (arena != NULL) {
    arena->Own(n);
  }
  return n;
}